

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXcFramework.cxx
# Opt level: O1

cmXcFrameworkPlistLibrary * __thiscall
cmXcFrameworkPlist::SelectSuitableLibrary
          (cmXcFrameworkPlist *this,cmMakefile *mf,cmListFileBacktrace *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmXcFrameworkPlistLibrary *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  cmake *this_00;
  cmXcFrameworkPlistLibrary *pcVar8;
  bool bVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string systemName;
  string supportedSystemName;
  long *local_140;
  char *local_138;
  long local_130 [2];
  cmXcFrameworkPlist *local_120;
  cmListFileBacktrace *local_118;
  cmMakefile *local_110;
  cmXcFrameworkPlistLibrary *local_108;
  string local_100;
  string local_e0;
  pointer local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  long *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_SYSTEM_NAME","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_e0);
  local_140 = local_130;
  pcVar2 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,pcVar2 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_118 = bt;
  local_110 = mf;
  bVar5 = cmMakefile::PlatformIsAppleSimulator(mf);
  pcVar3 = (this->AvailableLibraries).
           super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_120 = this;
  for (pcVar8 = (this->AvailableLibraries).
                super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar4 = pcVar8 == pcVar3, !bVar4;
      pcVar8 = pcVar8 + 1) {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity =
         local_e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    if ((ulong)pcVar8->SupportedPlatform < 5) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_e0,0,(char *)0x0,
                 (ulong)(&DAT_007f3ec4 +
                        *(int *)(&DAT_007f3ec4 + (ulong)pcVar8->SupportedPlatform * 4)));
    }
    if ((local_138 == (char *)local_e0._M_string_length) &&
       ((local_138 == (char *)0x0 ||
        (iVar6 = bcmp(local_140,local_e0._M_dataplus._M_p,(size_t)local_138), iVar6 == 0)))) {
      bVar9 = (pcVar8->SupportedPlatformVariant).
              super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>.
              _M_payload.super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>.
              _M_engaged == bVar5;
      if (bVar5 && bVar9) {
        bVar9 = (pcVar8->SupportedPlatformVariant).
                super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>.
                _M_payload.super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>.
                _M_payload._M_value == simulator;
      }
      if (!bVar9) goto LAB_0025fc6e;
      bVar9 = false;
      local_108 = pcVar8;
    }
    else {
LAB_0025fc6e:
      bVar9 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) break;
  }
  pcVar8 = local_108;
  if (bVar4) {
    this_00 = cmMakefile::GetCMakeInstance(local_110);
    local_e0._M_dataplus._M_p = (pointer)0x26;
    local_e0._M_string_length = 0x7f40d5;
    local_e0.field_2._M_allocated_capacity = 0;
    local_c0 = (local_120->Path)._M_dataplus._M_p;
    local_e0.field_2._8_8_ = (local_120->Path)._M_string_length;
    local_b8 = 0;
    local_b0 = 0x12;
    local_a8 = "\nfor system name \"";
    local_a0 = 0;
    local_98 = local_138;
    local_90 = local_140;
    local_88 = 0;
    local_78 = local_50;
    local_68 = 0;
    local_60 = 1;
    local_50[0] = 0x22;
    local_80 = 1;
    local_70 = 0;
    views._M_len = 5;
    views._M_array = (iterator)&local_e0;
    local_58 = local_78;
    cmCatViews(&local_100,views);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_100,local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    pcVar8 = (cmXcFrameworkPlistLibrary *)0x0;
  }
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  return pcVar8;
}

Assistant:

const cmXcFrameworkPlistLibrary* cmXcFrameworkPlist::SelectSuitableLibrary(
  const cmMakefile& mf, const cmListFileBacktrace& bt) const
{
  auto systemName = mf.GetSafeDefinition("CMAKE_SYSTEM_NAME");
  cm::optional<cmXcFrameworkPlistSupportedPlatformVariant> systemVariant;
  if (mf.PlatformIsAppleSimulator()) {
    systemVariant = cmXcFrameworkPlistSupportedPlatformVariant::simulator;
  }

  for (auto const& lib : this->AvailableLibraries) {
    std::string supportedSystemName;
    switch (lib.SupportedPlatform) {
      case cmXcFrameworkPlistSupportedPlatform::macOS:
        supportedSystemName = "Darwin";
        break;
      case cmXcFrameworkPlistSupportedPlatform::iOS:
        supportedSystemName = "iOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::tvOS:
        supportedSystemName = "tvOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::watchOS:
        supportedSystemName = "watchOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::visionOS:
        supportedSystemName = "visionOS";
        break;
    }

    if (systemName == supportedSystemName &&
        systemVariant == lib.SupportedPlatformVariant) {
      return &lib;
    }
  }

  mf.GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Unable to find suitable library in:\n  ", this->Path,
             "\nfor system name \"", systemName, '"'),
    bt);
  return nullptr;
}